

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall
wasm::RemoveUnusedBrs::sinkBlocks(wasm::Function*)::Sinker::visitBlock(wasm::Block__
          (void *this,Block *curr)

{
  Expression *pEVar1;
  If *this_00;
  Loop *pLVar2;
  bool bVar3;
  Index IVar4;
  size_t sVar5;
  Expression **ppEVar6;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  Name target_00;
  Name target_01;
  Name target_02;
  optional<wasm::Type> local_b8;
  optional<wasm::Type> local_a0;
  Expression *local_90;
  char *local_88;
  Expression *local_80;
  char *local_78;
  Expression **local_70;
  Expression **target;
  char *local_60;
  BasicType local_54;
  If *local_50;
  If *iff;
  optional<wasm::Type> local_40;
  optional<wasm::Type> local_30;
  Loop *local_20;
  Loop *loop;
  Block *curr_local;
  Sinker *this_local;
  
  loop = (Loop *)curr;
  curr_local = (Block *)this;
  bVar3 = IString::is(&(curr->name).super_IString);
  if (!bVar3) {
    return;
  }
  sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     &loop->body);
  if (sVar5 != 1) {
    return;
  }
  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       &loop->body,0);
  local_20 = Expression::dynCast<wasm::Loop>(*ppEVar6);
  if (local_20 != (Loop *)0x0) {
    pEVar1 = local_20->body;
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         &loop->body,0);
    pLVar2 = loop;
    *ppEVar6 = pEVar1;
    local_20->body = (Expression *)loop;
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              (&local_30,
               &(loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_30.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_30.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    Block::finalize((Block *)pLVar2,type_,Unknown);
    pLVar2 = local_20;
    std::optional<wasm::Type>::optional(&local_40);
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_40.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_40.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    Loop::finalize(pLVar2,type__00);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::replaceCurrent
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)this,(Expression *)local_20);
    *(undefined1 *)((long)this + 0xd8) = 1;
    return;
  }
  ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       &loop->body,0);
  local_50 = Expression::dynCast<wasm::If>(*ppEVar6);
  if (local_50 == (If *)0x0) {
    return;
  }
  local_54 = unreachable;
  bVar3 = wasm::Type::operator==(&local_50->condition->type,&local_54);
  if (bVar3) {
    return;
  }
  target = (Expression **)(loop->name).super_IString.str._M_len;
  local_60 = (loop->name).super_IString.str._M_str;
  target_00.super_IString.str._M_str = (char *)target;
  target_00.super_IString.str._M_len = (size_t)local_60;
  IVar4 = BranchUtils::BranchSeeker::count
                    ((BranchSeeker *)local_50->condition,(Expression *)target,target_00);
  if (IVar4 != 0) {
    return;
  }
  local_70 = (Expression **)0x0;
  if (local_50->ifFalse != (Expression *)0x0) {
    local_80 = (Expression *)(loop->name).super_IString.str._M_len;
    local_78 = (loop->name).super_IString.str._M_str;
    target_01.super_IString.str._M_str = (char *)local_80;
    target_01.super_IString.str._M_len = (size_t)local_78;
    IVar4 = BranchUtils::BranchSeeker::count((BranchSeeker *)local_50->ifFalse,local_80,target_01);
    if (IVar4 != 0) {
      local_90 = (Expression *)(loop->name).super_IString.str._M_len;
      local_88 = (loop->name).super_IString.str._M_str;
      target_02.super_IString.str._M_str = (char *)local_90;
      target_02.super_IString.str._M_len = (size_t)local_88;
      IVar4 = BranchUtils::BranchSeeker::count((BranchSeeker *)local_50->ifTrue,local_90,target_02);
      if (IVar4 == 0) {
        local_70 = &local_50->ifFalse;
      }
      goto LAB_020fe268;
    }
  }
  local_70 = &local_50->ifTrue;
LAB_020fe268:
  if (local_70 != (Expression **)0x0) {
    pEVar1 = *local_70;
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         &loop->body,0);
    pLVar2 = loop;
    *ppEVar6 = pEVar1;
    *local_70 = (Expression *)loop;
    std::optional<wasm::Type>::optional(&local_a0);
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_a0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_a0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    Block::finalize((Block *)pLVar2,type__01,Unknown);
    this_00 = local_50;
    std::optional<wasm::Type>::optional(&local_b8);
    type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    If::finalize(this_00,type__02);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::replaceCurrent
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)this,(Expression *)local_50);
    *(undefined1 *)((long)this + 0xd8) = 1;
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
        // If the block has a single child which is a loop, and the block is
        // named, then it is the exit for the loop. It's better to move it into
        // the loop, where it can be better optimized by other passes. Similar
        // logic for ifs: if the block is an exit for the if, we can move the
        // block in, consider for example:
        //    (block $label
        //     (if (..condition1..)
        //      (block
        //       (br_if $label (..condition2..))
        //       (..code..)
        //      )
        //     )
        //    )
        // After also merging the blocks, we have
        //    (if (..condition1..)
        //     (block $label
        //      (br_if $label (..condition2..))
        //      (..code..)
        //     )
        //    )
        // which can be further optimized later.
        if (curr->name.is() && curr->list.size() == 1) {
          if (auto* loop = curr->list[0]->dynCast<Loop>()) {
            curr->list[0] = loop->body;
            loop->body = curr;
            curr->finalize(curr->type);
            loop->finalize();
            replaceCurrent(loop);
            worked = true;
          } else if (auto* iff = curr->list[0]->dynCast<If>()) {
            if (iff->condition->type == Type::unreachable) {
              // The block result type may not be compatible with the arm result
              // types since the unreachable If can satisfy any type of block.
              // Just leave this for DCE.
              return;
            }
            // The label can't be used in the condition.
            if (BranchUtils::BranchSeeker::count(iff->condition, curr->name) ==
                0) {
              // We can move the block into either arm, if there are no uses in
              // the other.
              Expression** target = nullptr;
              if (!iff->ifFalse || BranchUtils::BranchSeeker::count(
                                     iff->ifFalse, curr->name) == 0) {
                target = &iff->ifTrue;
              } else if (BranchUtils::BranchSeeker::count(iff->ifTrue,
                                                          curr->name) == 0) {
                target = &iff->ifFalse;
              }
              if (target) {
                curr->list[0] = *target;
                *target = curr;
                // The block used to contain the if, and may have changed type
                // from unreachable to none, for example, if the if has an
                // unreachable condition but the arm is not unreachable.
                curr->finalize();
                iff->finalize();
                replaceCurrent(iff);
                worked = true;
                // Note that the type might change, e.g. if the if condition is
                // unreachable but the block that was on the outside had a
                // break.
              }
            }
          }
        }
      }